

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVersion.cpp
# Opt level: O2

void __thiscall
utVersion_aiGetBranchNameTest_Test::TestBody(utVersion_aiGetBranchNameTest_Test *this)

{
  char *message;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertionResult gtest_ar;
  
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_30.data_ = (AssertHelperData *)aiGetBranchName();
  testing::internal::CmpHelperNE<decltype(nullptr),char_const*>
            ((internal *)&gtest_ar,"nullptr","aiGetBranchName()",&local_28.ptr_,(char **)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVersion.cpp"
               ,0x4a,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F( utVersion, aiGetBranchNameTest ) {
    EXPECT_NE( nullptr, aiGetBranchName() );
}